

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.cpp
# Opt level: O2

void __thiscall cbtBvhTree::build_tree(cbtBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes)

{
  GIM_BVH_TREE_NODE local_34;
  
  *(undefined4 *)this = 0;
  local_34.m_escapeIndexOrDataIndex = 0;
  cbtAlignedObjectArray<GIM_BVH_TREE_NODE>::resize
            ((cbtAlignedObjectArray<GIM_BVH_TREE_NODE> *)(this + 8),
             (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size * 2,&local_34);
  _build_sub_tree(this,primitive_boxes,0,
                  (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size);
  return;
}

Assistant:

void cbtBvhTree::build_tree(
	GIM_BVH_DATA_ARRAY& primitive_boxes)
{
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}